

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# compactor.cc
# Opt level: O0

fdb_status
compactor_get_actual_filename
          (char *filename,char *actual_filename,fdb_compaction_mode_t comp_mode,
          err_log_callback *log_callback)

{
  int iVar1;
  bool bVar2;
  int iVar3;
  compactor_meta *pcVar4;
  size_t sVar5;
  DIR *__dirp;
  dirent *pdVar6;
  char in_DL;
  char *in_RSI;
  char *in_RDI;
  dirent *dir_entry;
  DIR *dir_info;
  compactor_meta *meta_ptr;
  compactor_meta meta;
  fdb_status fs;
  char ret_name [1024];
  char prefix [1024];
  char dirname [1024];
  char path [1024];
  int max_compaction_no;
  int compaction_no;
  int dirname_len;
  int filename_len;
  int i;
  char *in_stack_ffffffffffffeb80;
  char *__s1;
  char *in_stack_ffffffffffffeb88;
  char *__s2;
  char *in_stack_ffffffffffffeb90;
  char *in_stack_ffffffffffffec10;
  char local_1048 [1024];
  char local_c48 [1024];
  char local_848 [512];
  err_log_callback *in_stack_fffffffffffff9b8;
  compactor_meta *in_stack_fffffffffffff9c0;
  char *in_stack_fffffffffffff9c8;
  char local_448 [1036];
  uint local_3c;
  uint local_38;
  int local_34;
  int local_30;
  int local_2c;
  char local_19;
  char *local_18;
  char *local_10;
  
  local_3c = 0xffffffff;
  local_19 = in_DL;
  local_18 = in_RSI;
  local_10 = in_RDI;
  sprintf(local_448,"%s.meta",in_RDI);
  pcVar4 = _compactor_read_metafile
                     (in_stack_fffffffffffff9c8,in_stack_fffffffffffff9c0,in_stack_fffffffffffff9b8)
  ;
  if (pcVar4 == (compactor_meta *)0x0) {
    if ((local_19 == '\0') && (bVar2 = does_file_exist(in_stack_ffffffffffffec10), bVar2)) {
      strcpy(local_18,local_10);
    }
    else {
      sVar5 = strlen(local_10);
      local_30 = (int)sVar5;
      local_34 = 0;
      iVar3 = local_30;
      do {
        local_2c = iVar3 + -1;
        iVar1 = local_34;
        if (local_2c < 0) break;
        iVar1 = iVar3;
        iVar3 = local_2c;
      } while (local_10[local_2c] != '/');
      local_34 = iVar1;
      if (local_34 < 1) {
        strcpy(local_848,".");
      }
      else {
        strncpy(local_848,local_10,(long)local_34);
        local_848[local_34] = '\0';
      }
      strcpy(local_c48,local_10 + local_34);
      strcat(local_c48,".");
      __dirp = opendir(local_848);
      if (__dirp != (DIR *)0x0) {
        while (pdVar6 = readdir(__dirp), pdVar6 != (dirent *)0x0) {
          __s1 = pdVar6->d_name;
          __s2 = local_c48;
          sVar5 = strlen(local_c48);
          iVar3 = strncmp(__s1,__s2,sVar5);
          if (iVar3 == 0) {
            local_38 = 0xffffffff;
            sVar5 = strlen(local_c48);
            __isoc99_sscanf(pdVar6->d_name + sVar5,"%d",&local_38);
            if ((-1 < (int)local_38) && ((int)local_3c < (int)local_38)) {
              local_3c = local_38;
            }
          }
        }
        closedir(__dirp);
      }
      if ((int)local_3c < 0) {
        if (local_19 != '\x01') {
          strcpy(local_18,local_10);
          return FDB_RESULT_SUCCESS;
        }
        sprintf(local_1048,"%s.0",local_10);
      }
      else {
        sprintf(local_1048,"%s.%d",local_10,(ulong)local_3c);
      }
      strcpy(local_18,local_1048);
    }
  }
  else {
    _reconstruct_path(in_stack_ffffffffffffeb90,in_stack_ffffffffffffeb88,in_stack_ffffffffffffeb80)
    ;
    strcpy(local_18,local_1048);
  }
  return FDB_RESULT_SUCCESS;
}

Assistant:

fdb_status compactor_get_actual_filename(const char *filename,
                                         char *actual_filename,
                                         fdb_compaction_mode_t comp_mode,
                                         err_log_callback *log_callback)
{
    int i;
    int filename_len;
    int dirname_len;
    int compaction_no, max_compaction_no = -1;
    char path[MAX_FNAMELEN];
    char dirname[MAX_FNAMELEN], prefix[MAX_FNAMELEN];
    char ret_name[MAX_FNAMELEN];
    fdb_status fs = FDB_RESULT_SUCCESS;
    struct compactor_meta meta, *meta_ptr;

    // get actual filename from metafile
    sprintf(path, "%s.meta", filename);
    meta_ptr = _compactor_read_metafile(path, &meta, log_callback);

    if (meta_ptr == NULL) {
        if (comp_mode == FDB_COMPACTION_MANUAL && does_file_exist(filename)) {
            strcpy(actual_filename, filename);
            return FDB_RESULT_SUCCESS;
        }

        // error handling .. scan directory
        // backward search until find the first '/' or '\' (Windows)
        filename_len = strlen(filename);
        dirname_len = 0;

#if !defined(WIN32) && !defined(_WIN32)
        DIR *dir_info;
        struct dirent *dir_entry;

        for (i=filename_len-1; i>=0; --i){
            if (filename[i] == '/') {
                dirname_len = i+1;
                break;
            }
        }

        if (dirname_len > 0) {
            strncpy(dirname, filename, dirname_len);
            dirname[dirname_len] = 0;
        } else {
            strcpy(dirname, ".");
        }
        strcpy(prefix, filename + dirname_len);
        strcat(prefix, ".");

        dir_info = opendir(dirname);
        if (dir_info != NULL) {
            while ((dir_entry = readdir(dir_info))) {
                if (!strncmp(dir_entry->d_name, prefix, strlen(prefix))) {
                    compaction_no = -1;
                    sscanf(dir_entry->d_name + strlen(prefix), "%d", &compaction_no);
                    if (compaction_no >= 0) {
                        if (compaction_no > max_compaction_no) {
                            max_compaction_no = compaction_no;
                        }
                    }
                }
            }
            closedir(dir_info);
        }
#else
        // Windows
        for (i=filename_len-1; i>=0; --i){
            if (filename[i] == '/' || filename[i] == '\\') {
                dirname_len = i+1;
                break;
            }
        }

        if (dirname_len > 0) {
            strncpy(dirname, filename, dirname_len);
            dirname[dirname_len] = 0;
        } else {
            strcpy(dirname, ".");
        }
        strcpy(prefix, filename + dirname_len);
        strcat(prefix, ".");

        WIN32_FIND_DATA filedata;
        HANDLE hfind;
        char query_str[MAX_FNAMELEN];

        // find all files start with 'prefix'
        sprintf(query_str, "%s*", prefix);
        hfind = FindFirstFile(query_str, &filedata);
        while (hfind != INVALID_HANDLE_VALUE) {
            if (!strncmp(filedata.cFileName, prefix, strlen(prefix))) {
                compaction_no = -1;
                sscanf(filedata.cFileName + strlen(prefix), "%d", &compaction_no);
                if (compaction_no >= 0) {
                    if (compaction_no > max_compaction_no) {
                        max_compaction_no = compaction_no;
                    }
                }
            }

            if (!FindNextFile(hfind, &filedata)) {
                FindClose(hfind);
                hfind = INVALID_HANDLE_VALUE;
            }
        }

#endif

        if (max_compaction_no < 0) {
            if (comp_mode == FDB_COMPACTION_AUTO) {
                // DB files with a revision number are not found.
                // initialize filename to '[filename].0'
                sprintf(ret_name, "%s.0", filename);
            } else { // Manual compaction mode.
                // Simply use the file name passed to this function.
                strcpy(actual_filename, filename);
                return FDB_RESULT_SUCCESS;
            }
        } else {
            // return the file that has the largest compaction number
            sprintf(ret_name, "%s.%d", filename, max_compaction_no);
            fs = FDB_RESULT_SUCCESS;
        }
        if (fs == FDB_RESULT_SUCCESS) {
            strcpy(actual_filename, ret_name);
        }
        return fs;

    } else {
        // metadata is successfully read from the metafile .. just return the filename
        _reconstruct_path(ret_name, (char*)filename, meta.filename);
        strcpy(actual_filename, ret_name);
        return FDB_RESULT_SUCCESS;
    }
}